

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O0

fy_atom * fy_fill_atom_mark(fy_input *fyi,fy_mark *start_mark,fy_mark *end_mark,fy_atom *handle)

{
  int iVar1;
  fy_atom *handle_local;
  fy_mark *end_mark_local;
  fy_mark *start_mark_local;
  fy_input *fyi_local;
  
  if ((((fyi == (fy_input *)0x0) || (start_mark == (fy_mark *)0x0)) || (end_mark == (fy_mark *)0x0))
     || (handle == (fy_atom *)0x0)) {
    fyi_local = (fy_input *)0x0;
  }
  else {
    memset(handle,0,0x38);
    (handle->start_mark).input_pos = start_mark->input_pos;
    iVar1 = start_mark->column;
    (handle->start_mark).line = start_mark->line;
    (handle->start_mark).column = iVar1;
    (handle->end_mark).input_pos = end_mark->input_pos;
    iVar1 = end_mark->column;
    (handle->end_mark).line = end_mark->line;
    (handle->end_mark).column = iVar1;
    handle->fyi = fyi;
    *(uint *)&handle->field_0x34 = *(uint *)&handle->field_0x34 & 0xffffffc0;
    *(uint *)&handle->field_0x34 = *(uint *)&handle->field_0x34 & 0xfffffc3f | 0x40;
    handle->storage_hint = 0;
    *(uint *)&handle->field_0x34 = *(uint *)&handle->field_0x34 & 0xfffff7ff;
    fyi_local = (fy_input *)handle;
  }
  return (fy_atom *)fyi_local;
}

Assistant:

struct fy_atom *fy_fill_atom_mark(struct fy_input *fyi,
                                  const struct fy_mark *start_mark,
                                  const struct fy_mark *end_mark,
                                  struct fy_atom *handle) {
    if (!fyi || !start_mark || !end_mark || !handle)
        return NULL;

    memset(handle, 0, sizeof(*handle));

    handle->start_mark = *start_mark;
    handle->end_mark = *end_mark;
    handle->fyi = fyi;

    /* default is plain, modify at return */
    handle->style = FYAS_PLAIN;
    handle->chomp = FYAC_CLIP;
    /* by default we don't do storage hints, it's the job of the caller */
    handle->storage_hint = 0;
    handle->storage_hint_valid = false;

    return handle;
}